

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_remove_sliver(REF_GRID ref_grid,REF_INT *quad)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL complete;
  REF_INT *quad_local;
  REF_GRID ref_grid_local;
  
  _ref_private_macro_code_rss = quad;
  quad_local = (REF_INT *)ref_grid;
  uVar1 = ref_layer_swap(ref_grid,*quad,quad[2],quad[1],&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    if (ref_private_macro_code_rss_1 == 0) {
      uVar1 = ref_layer_swap((REF_GRID)quad_local,*_ref_private_macro_code_rss,
                             _ref_private_macro_code_rss[2],_ref_private_macro_code_rss[3],
                             &ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        if (ref_private_macro_code_rss_1 == 0) {
          uVar1 = ref_layer_swap((REF_GRID)quad_local,_ref_private_macro_code_rss[1],
                                 _ref_private_macro_code_rss[3],*_ref_private_macro_code_rss,
                                 &ref_private_macro_code_rss_1);
          if (uVar1 == 0) {
            if (ref_private_macro_code_rss_1 == 0) {
              ref_grid_local._4_4_ =
                   ref_layer_swap((REF_GRID)quad_local,_ref_private_macro_code_rss[1],
                                  _ref_private_macro_code_rss[3],_ref_private_macro_code_rss[2],
                                  &ref_private_macro_code_rss_1);
              if (ref_grid_local._4_4_ == 0) {
                if (ref_private_macro_code_rss_1 == 0) {
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  ref_grid_local._4_4_ = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x3d6,"ref_layer_remove_sliver",(ulong)ref_grid_local._4_4_,"quad3");
              }
            }
            else {
              ref_grid_local._4_4_ = 0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x3d4,"ref_layer_remove_sliver",(ulong)uVar1,"quad0");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          ref_grid_local._4_4_ = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x3d2,"ref_layer_remove_sliver",(ulong)uVar1,"quad1");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x3d0,
           "ref_layer_remove_sliver",(ulong)uVar1,"quad1");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_remove_sliver(REF_GRID ref_grid,
                                                  REF_INT *quad) {
  REF_BOOL complete;
  RSS(ref_layer_swap(ref_grid, quad[0], quad[2], quad[1], &complete), "quad1");
  if (complete) return REF_SUCCESS;
  RSS(ref_layer_swap(ref_grid, quad[0], quad[2], quad[3], &complete), "quad1");
  if (complete) return REF_SUCCESS;
  RSS(ref_layer_swap(ref_grid, quad[1], quad[3], quad[0], &complete), "quad0");
  if (complete) return REF_SUCCESS;
  RSS(ref_layer_swap(ref_grid, quad[1], quad[3], quad[2], &complete), "quad3");
  if (complete) return REF_SUCCESS;
  return REF_SUCCESS;
}